

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O2

double __thiscall double_conversion::Double::PreviousDouble(Double *this)

{
  uint64_t uVar1;
  double dVar2;
  
  uVar1 = this->d64_;
  if (uVar1 == 0xfff0000000000000) {
    return -INFINITY;
  }
  if ((long)uVar1 < 0) {
    dVar2 = (double)(uVar1 + 1);
  }
  else {
    if (uVar1 == 0) {
      return -0.0;
    }
    dVar2 = (double)(uVar1 - 1);
  }
  return dVar2;
}

Assistant:

double PreviousDouble() const {
    if (d64_ == (kInfinity | kSignMask)) return -Infinity();
    if (Sign() < 0) {
      return Double(d64_ + 1).value();
    } else {
      if (Significand() == 0) return -0.0;
      return Double(d64_ - 1).value();
    }
  }